

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&,char>&>
                 (char *begin,char *end,
                 id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
                 *handler)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  basic_string_view<char> id;
  
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
                ,0xa8e,"");
  }
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    uVar2 = (handler->handler->parse_context).next_arg_id_;
    if ((int)uVar2 < 0) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
    }
    (handler->handler->parse_context).next_arg_id_ = uVar2 + 1;
    pbVar5 = (byte *)begin;
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    pbVar5 = (byte *)(begin + 1);
    if (bVar1 == 0x30) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      pbVar4 = pbVar5;
      while (uVar2 < 0xccccccd) {
        uVar2 = ((int)(char)pbVar4[-1] + uVar2 * 10) - 0x30;
        pbVar5 = (byte *)end;
        if ((pbVar4 == (byte *)end) ||
           (bVar1 = *pbVar4, pbVar5 = pbVar4, pbVar4 = pbVar4 + 1, 9 < (byte)(bVar1 - 0x30)))
        goto LAB_00395565;
      }
      uVar2 = 0x80000000;
      pbVar5 = pbVar4 + -1;
LAB_00395565:
      if ((int)uVar2 < 0) {
        error_handler::on_error((error_handler *)begin,"number is too big");
      }
    }
    if ((pbVar5 == (byte *)end) || ((*pbVar5 != 0x3a && (*pbVar5 != 0x7d)))) {
LAB_003955b4:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    if (0 < (handler->handler->parse_context).next_arg_id_) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from automatic to manual argument indexing");
    }
    (handler->handler->parse_context).next_arg_id_ = -1;
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_003955b4;
    pbVar4 = (byte *)(begin + 1);
    do {
      pbVar3 = pbVar4;
      pbVar5 = (byte *)end;
      if (pbVar3 == (byte *)end) break;
      bVar1 = *pbVar3;
      pbVar4 = pbVar3 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar5 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    id.size_ = (long)pbVar5 - (long)begin;
    if ((long)id.size_ < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    id.data_ = begin;
    uVar2 = format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            ::on_arg_id(handler->handler,id);
  }
  handler->arg_id = uVar2;
  return (char *)pbVar5;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}